

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  byte bVar1;
  char cVar2;
  double dVar3;
  double dVar4;
  lexeme_t lVar5;
  nodetest_t nVar6;
  xpath_ast_node *pxVar7;
  char_t *pcVar8;
  xpath_ast_node *pxVar9;
  xpath_ast_node *pxVar10;
  xpath_ast_node **ppxVar11;
  xpath_parser *in_RCX;
  size_t length;
  long lVar12;
  xpath_parser *pxVar13;
  xpath_context *c;
  xpath_parser *pxVar14;
  char cVar15;
  xpath_ast_node **unaff_RBP;
  char *pcVar16;
  xpath_allocator_capture *this_00;
  xpath_ast_node *unaff_R12;
  xpath_node *pxVar17;
  xpath_parser *unaff_R13;
  undefined7 uVar18;
  xpath_ast_node *unaff_R14;
  xpath_memory_block *pxVar19;
  xpath_string xVar20;
  xpath_allocator_capture xStack_110;
  xpath_allocator *pxStack_f8;
  xpath_memory_block *pxStack_f0;
  xpath_memory_block *pxStack_e8;
  xpath_node_set_raw xStack_d8;
  xpath_allocator_capture xStack_b8;
  xpath_allocator_capture xStack_a0;
  xpath_parser *pxStack_88;
  xpath_ast_node *pxStack_80;
  xpath_parser *pxStack_78;
  xpath_ast_node *pxStack_70;
  xpath_ast_node *pxStack_68;
  xpath_ast_node **ppxStack_60;
  xpath_parser *local_50;
  xpath_lexer_string local_48;
  
  if ((set != (xpath_ast_node *)0x0) && (set->_rettype != '\x01')) {
    ppxStack_60 = (xpath_ast_node **)0x11f9a5;
    throw_error(this,"Step has to be applied to node set");
LAB_0011f9a5:
    pxVar14 = this;
    pcVar16 = "Unrecognized node test";
    goto LAB_0011f9d0;
  }
  unaff_R14 = (xpath_ast_node *)&this->_lexer;
  lVar5 = (this->_lexer)._cur_lexeme;
  if (lVar5 == lex_double_dot) {
    ppxStack_60 = (xpath_ast_node **)0x11f3b5;
    xpath_lexer::next((xpath_lexer *)unaff_R14);
    ppxStack_60 = (xpath_ast_node **)0x11f3bd;
    pxVar7 = (xpath_ast_node *)alloc_node((xpath_parser *)this->_alloc);
    pxVar7->_type = '8';
    pxVar7->_rettype = '\x01';
    pxVar7->_axis = '\t';
    pxVar7->_test = '\x02';
LAB_0011f3c6:
    pxVar7->_left = set;
    pxVar7->_right = (xpath_ast_node *)0x0;
    pxVar7->_next = (xpath_ast_node *)0x0;
    (pxVar7->_data).string = (char_t *)0x0;
    return pxVar7;
  }
  if (lVar5 == lex_dot) {
    ppxStack_60 = (xpath_ast_node **)0x11f39d;
    xpath_lexer::next((xpath_lexer *)unaff_R14);
    ppxStack_60 = (xpath_ast_node **)0x11f3a5;
    pxVar7 = (xpath_ast_node *)alloc_node((xpath_parser *)this->_alloc);
    pxVar7->_type = '8';
    pxVar7->_rettype = '\x01';
    pxVar7->_axis = '\f';
    pxVar7->_test = '\x02';
    goto LAB_0011f3c6;
  }
  uVar18 = (undefined7)((ulong)unaff_R13 >> 8);
  local_50 = this;
  if (lVar5 == lex_axis_attribute) {
    ppxStack_60 = (xpath_ast_node **)0x11f38d;
    xpath_lexer::next((xpath_lexer *)unaff_R14);
    lVar5 = (this->_lexer)._cur_lexeme;
    unaff_R13 = (xpath_parser *)CONCAT71(uVar18,2);
    unaff_RBP = (xpath_ast_node **)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  }
  else {
    unaff_R13 = (xpath_parser *)CONCAT71(uVar18,3);
    unaff_RBP = (xpath_ast_node **)0x0;
  }
  pxVar14 = local_50;
  local_48.begin = (char_t *)0x0;
  local_48.end = (char_t *)0x0;
  if (lVar5 == lex_multiply) {
LAB_0011f4f9:
    local_48.end = (char_t *)0x0;
    local_48.begin = (char_t *)0x0;
    ppxStack_60 = (xpath_ast_node **)0x11f4fe;
    xpath_lexer::next((xpath_lexer *)unaff_R14);
    cVar15 = '\a';
    goto LAB_0011f501;
  }
  if (lVar5 != lex_string) goto LAB_0011f9a5;
  unaff_R12 = (xpath_ast_node *)&(local_50->_lexer)._cur_lexeme_contents;
  local_48.begin = (local_50->_lexer)._cur_lexeme_contents.begin;
  local_48.end = (local_50->_lexer)._cur_lexeme_contents.end;
  ppxStack_60 = (xpath_ast_node **)0x11f417;
  xpath_lexer::next((xpath_lexer *)unaff_R14);
  lVar5 = (pxVar14->_lexer)._cur_lexeme;
  if (lVar5 == lex_double_colon) {
    if ((char)unaff_RBP != '\0') {
      pcVar16 = "Two axis specifiers in one step";
      goto LAB_0011f9d0;
    }
    bVar1 = *(byte *)(xpath_allocator **)local_48.begin;
    uVar18 = (undefined7)((ulong)unaff_R13 >> 8);
    in_RCX = (xpath_parser *)local_48.end;
    if (bVar1 < 0x6e) {
      switch(bVar1) {
      case 0x61:
        pxVar13 = (xpath_parser *)((long)local_48.end - (long)local_48.begin);
        if (pxVar13 != (xpath_parser *)0x0) {
          lVar12 = 0;
          do {
            if ("ancestor"[lVar12] != *(char *)(lVar12 + (long)(xpath_allocator **)local_48.begin))
            goto LAB_0011f492;
            lVar12 = lVar12 + 1;
          } while (pxVar13 != (xpath_parser *)lVar12);
        }
        if ("ancestor"[(long)pxVar13] == '\0') {
          unaff_R13 = (xpath_parser *)0x0;
        }
        else {
LAB_0011f492:
          if (local_48.end != local_48.begin) {
            lVar12 = 0;
            do {
              if ("ancestor-or-self"[lVar12] !=
                  *(char *)(lVar12 + (long)(xpath_allocator **)local_48.begin)) goto LAB_0011f4c3;
              lVar12 = lVar12 + 1;
            } while (pxVar13 != (xpath_parser *)lVar12);
          }
          if (*(undefined1 *)((long)&pxVar13[0x41ab]._query + 6) != '\0') {
LAB_0011f4c3:
            if (local_48.end != local_48.begin) {
              in_RCX = (xpath_parser *)0x0;
              do {
                if (*(char *)((long)&in_RCX[0x415b]._lexer._cur_lexeme_contents.end + 5) !=
                    *(char *)((long)(xpath_allocator **)local_48.begin + (long)in_RCX))
                goto switchD_0011f45c_caseD_62;
                in_RCX = (xpath_parser *)((long)&in_RCX->_alloc + 1);
              } while (pxVar13 != in_RCX);
            }
            pcVar16 = "attribute";
            unaff_R13 = (xpath_parser *)CONCAT71(uVar18,2);
            goto LAB_0011f7ae;
          }
          unaff_R13 = (xpath_parser *)CONCAT71(uVar18,1);
        }
        break;
      default:
        goto switchD_0011f45c_caseD_62;
      case 99:
        in_RCX = (xpath_parser *)((long)local_48.end - (long)local_48.begin);
        if (in_RCX != (xpath_parser *)0x0) {
          lVar12 = 0;
          do {
            if ("child"[lVar12] != *(char *)(lVar12 + (long)(xpath_allocator **)local_48.begin))
            goto switchD_0011f45c_caseD_62;
            lVar12 = lVar12 + 1;
          } while (in_RCX != (xpath_parser *)lVar12);
        }
        pcVar16 = "child";
        unaff_R13 = (xpath_parser *)CONCAT71(uVar18,3);
        goto LAB_0011f7e7;
      case 100:
        pxVar13 = (xpath_parser *)((long)local_48.end - (long)local_48.begin);
        if (pxVar13 != (xpath_parser *)0x0) {
          lVar12 = 0;
          do {
            if ("descendant"[lVar12] != *(char *)(lVar12 + (long)(xpath_allocator **)local_48.begin)
               ) goto LAB_0011f6e8;
            lVar12 = lVar12 + 1;
          } while (pxVar13 != (xpath_parser *)lVar12);
        }
        if ("descendant"[(long)pxVar13] == '\0') {
          unaff_R13 = (xpath_parser *)CONCAT71(uVar18,4);
        }
        else {
LAB_0011f6e8:
          if (local_48.end != local_48.begin) {
            in_RCX = (xpath_parser *)0x0;
            do {
              if (*(char *)&in_RCX[0x41ac]._lexer._cur_lexeme_pos !=
                  *(char *)((long)(xpath_allocator **)local_48.begin + (long)in_RCX))
              goto switchD_0011f45c_caseD_62;
              in_RCX = (xpath_parser *)((long)&in_RCX->_alloc + 1);
            } while (pxVar13 != in_RCX);
          }
          pcVar16 = "descendant-or-self";
          unaff_R13 = (xpath_parser *)CONCAT71(uVar18,5);
LAB_0011f7ae:
          if (*(char *)((long)&pxVar13->_alloc + (long)pcVar16) != '\0')
          goto switchD_0011f45c_caseD_62;
        }
        break;
      case 0x66:
        pxVar13 = (xpath_parser *)((long)local_48.end - (long)local_48.begin);
        if (pxVar13 != (xpath_parser *)0x0) {
          lVar12 = 0;
          do {
            if ("following"[lVar12] != *(char *)(lVar12 + (long)(xpath_allocator **)local_48.begin))
            goto LAB_0011f64e;
            lVar12 = lVar12 + 1;
          } while (pxVar13 != (xpath_parser *)lVar12);
        }
        if ("following"[(long)pxVar13] != '\0') {
LAB_0011f64e:
          if (local_48.end != local_48.begin) {
            in_RCX = (xpath_parser *)0x0;
            do {
              if (in_RCX[0x41ac]._lexer.field_0x25 !=
                  *(char *)((long)(xpath_allocator **)local_48.begin + (long)in_RCX))
              goto switchD_0011f45c_caseD_62;
              in_RCX = (xpath_parser *)((long)&in_RCX->_alloc + 1);
            } while (pxVar13 != in_RCX);
          }
          pcVar16 = "following-sibling";
          unaff_R13 = (xpath_parser *)CONCAT71(uVar18,7);
          goto LAB_0011f7ae;
        }
        unaff_R13 = (xpath_parser *)CONCAT71(uVar18,6);
      }
LAB_0011f7f1:
      ppxStack_60 = (xpath_ast_node **)0x11f7fc;
      xpath_lexer::next((xpath_lexer *)unaff_R14);
      lVar5 = (local_50->_lexer)._cur_lexeme;
      if (lVar5 == lex_multiply) goto LAB_0011f4f9;
      this = (xpath_parser *)unaff_R14;
      if (lVar5 != lex_string) goto LAB_0011f9a5;
      local_48.begin = ((xpath_lexer_string *)unaff_R12)->begin;
      local_48.end = (pxVar14->_lexer)._cur_lexeme_contents.end;
      ppxStack_60 = (xpath_ast_node **)0x11f828;
      xpath_lexer::next((xpath_lexer *)unaff_R14);
      lVar5 = (local_50->_lexer)._cur_lexeme;
      goto LAB_0011f830;
    }
    if (bVar1 == 0x6e) {
      in_RCX = (xpath_parser *)((long)local_48.end - (long)local_48.begin);
      if (in_RCX != (xpath_parser *)0x0) {
        lVar12 = 0;
        do {
          if ("namespace"[lVar12] != *(char *)(lVar12 + (long)(xpath_allocator **)local_48.begin))
          goto switchD_0011f45c_caseD_62;
          lVar12 = lVar12 + 1;
        } while (in_RCX != (xpath_parser *)lVar12);
      }
      pcVar16 = "namespace";
      unaff_R13 = (xpath_parser *)CONCAT71(uVar18,8);
    }
    else {
      if (bVar1 == 0x70) {
        pxVar13 = (xpath_parser *)((long)local_48.end - (long)local_48.begin);
        if (pxVar13 != (xpath_parser *)0x0) {
          lVar12 = 0;
          do {
            if ("parent"[lVar12] != *(char *)(lVar12 + (long)(xpath_allocator **)local_48.begin))
            goto LAB_0011f74f;
            lVar12 = lVar12 + 1;
          } while (pxVar13 != (xpath_parser *)lVar12);
        }
        if ("parent"[(long)pxVar13] == '\0') {
          unaff_R13 = (xpath_parser *)CONCAT71(uVar18,9);
        }
        else {
LAB_0011f74f:
          if (local_48.end != local_48.begin) {
            lVar12 = 0;
            do {
              if ("preceding"[lVar12] !=
                  *(char *)(lVar12 + (long)(xpath_allocator **)local_48.begin)) goto LAB_0011f780;
              lVar12 = lVar12 + 1;
            } while (pxVar13 != (xpath_parser *)lVar12);
          }
          if ("preceding"[(long)pxVar13] != '\0') {
LAB_0011f780:
            if (local_48.end != local_48.begin) {
              in_RCX = (xpath_parser *)0x0;
              do {
                if (*(char *)((long)&in_RCX[0x41ad]._lexer._cur_lexeme_pos + 2) !=
                    *(char *)((long)(xpath_allocator **)local_48.begin + (long)in_RCX))
                goto switchD_0011f45c_caseD_62;
                in_RCX = (xpath_parser *)((long)&in_RCX->_alloc + 1);
              } while (pxVar13 != in_RCX);
            }
            pcVar16 = "preceding-sibling";
            unaff_R13 = (xpath_parser *)CONCAT71(uVar18,0xb);
            goto LAB_0011f7ae;
          }
          unaff_R13 = (xpath_parser *)CONCAT71(uVar18,10);
        }
        goto LAB_0011f7f1;
      }
      if (bVar1 != 0x73) goto switchD_0011f45c_caseD_62;
      in_RCX = (xpath_parser *)((long)local_48.end - (long)local_48.begin);
      if (in_RCX != (xpath_parser *)0x0) {
        lVar12 = 0;
        do {
          if ("ancestor-or-self"[lVar12 + 0xc] !=
              *(char *)(lVar12 + (long)(xpath_allocator **)local_48.begin))
          goto switchD_0011f45c_caseD_62;
          lVar12 = lVar12 + 1;
        } while (in_RCX != (xpath_parser *)lVar12);
      }
      pcVar16 = "self";
      unaff_R13 = (xpath_parser *)CONCAT71(uVar18,0xc);
    }
LAB_0011f7e7:
    if (pcVar16[(long)&in_RCX->_alloc] == '\0') goto LAB_0011f7f1;
switchD_0011f45c_caseD_62:
    pcVar16 = "Unknown axis";
  }
  else {
LAB_0011f830:
    if (lVar5 != lex_open_brace) {
      in_RCX = (xpath_parser *)((long)local_48.end - (long)local_48.begin);
      cVar15 = '\x01';
      if (((2 < (long)in_RCX) &&
          (*(char *)((long)&((xpath_parser *)((long)local_48.end + -0x48))->_result + 6) == ':')) &&
         (*(char *)((long)&((xpath_parser *)((long)local_48.end + -0x48))->_result + 7) == '*')) {
        local_48.end = (char_t *)
                       ((long)&((xpath_parser *)((long)local_48.end + -0x48))->_result + 7);
        cVar15 = '\b';
      }
LAB_0011f501:
      pxVar14 = local_50;
      ppxStack_60 = (xpath_ast_node **)0x11f50e;
      unaff_R12 = (xpath_ast_node *)alloc_node((xpath_parser *)local_50->_alloc);
      ppxStack_60 = (xpath_ast_node **)0x11f51e;
      pcVar8 = alloc_string((xpath_parser *)pxVar14->_alloc,&local_48);
      unaff_R12->_type = '8';
      unaff_R12->_rettype = '\x01';
      unaff_R12->_axis = (char)unaff_R13;
      unaff_R12->_test = cVar15;
      unaff_R12->_left = set;
      unaff_R12->_right = (xpath_ast_node *)0x0;
      unaff_R12->_next = (xpath_ast_node *)0x0;
      (unaff_R12->_data).string = pcVar8;
      if ((pxVar14->_lexer)._cur_lexeme != lex_open_square_brace) {
        return unaff_R12;
      }
      unaff_RBP = &unaff_R12->_right;
      unaff_R13 = pxVar14;
      pxVar7 = (xpath_ast_node *)0x0;
      while( true ) {
        ppxStack_60 = (xpath_ast_node **)0x11f55e;
        xpath_lexer::next((xpath_lexer *)unaff_R14);
        ppxStack_60 = (xpath_ast_node **)0x11f566;
        pxVar9 = parse_expression(unaff_R13);
        ppxStack_60 = (xpath_ast_node **)0x11f576;
        pxVar10 = (xpath_ast_node *)alloc_node((xpath_parser *)local_50->_alloc);
        unaff_R13 = local_50;
        pxVar10->_type = '\x0f';
        pxVar10->_rettype = '\x01';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        pxVar10->_left = pxVar9;
        pxVar10->_right = (xpath_ast_node *)0x0;
        pxVar10->_next = (xpath_ast_node *)0x0;
        if ((local_50->_lexer)._cur_lexeme != lex_close_square_brace) break;
        ppxStack_60 = (xpath_ast_node **)0x11f5a2;
        xpath_lexer::next((xpath_lexer *)unaff_R14);
        ppxVar11 = &pxVar7->_next;
        if (pxVar7 == (xpath_ast_node *)0x0) {
          ppxVar11 = unaff_RBP;
        }
        *ppxVar11 = pxVar10;
        pxVar7 = pxVar10;
        set = pxVar10;
        if ((unaff_R13->_lexer)._cur_lexeme != lex_open_square_brace) {
          return unaff_R12;
        }
      }
      ppxStack_60 = (xpath_ast_node **)0x11f984;
      throw_error(local_50,"Unmatched square brace");
      pxVar14 = (xpath_parser *)unaff_R14;
      unaff_R14 = pxVar7;
      goto switchD_0011f45c_caseD_62;
    }
    ppxStack_60 = (xpath_ast_node **)0x11f840;
    xpath_lexer::next((xpath_lexer *)unaff_R14);
    lVar5 = (local_50->_lexer)._cur_lexeme;
    if (lVar5 == lex_close_brace) {
      ppxStack_60 = (xpath_ast_node **)0x11f855;
      xpath_lexer::next((xpath_lexer *)unaff_R14);
      ppxStack_60 = (xpath_ast_node **)0x11f864;
      nVar6 = parse_node_test_type
                        ((xpath_parser *)local_48.begin,(xpath_lexer_string *)local_48.end);
      if (nVar6 != nodetest_none) {
        cVar15 = (char)nVar6;
        local_48.begin = (char_t *)0x0;
        local_48.end = (char_t *)0x0;
        goto LAB_0011f501;
      }
      pcVar16 = "Unrecognized node type";
      pxVar14 = (xpath_parser *)unaff_R14;
    }
    else {
      in_RCX = (xpath_parser *)((long)local_48.end - (long)local_48.begin);
      if (in_RCX != (xpath_parser *)0x0) {
        lVar12 = 0;
        do {
          if ("processing-instruction"[lVar12] !=
              *(char *)(lVar12 + (long)(xpath_allocator **)local_48.begin)) goto LAB_0011f98d;
          lVar12 = lVar12 + 1;
        } while (in_RCX != (xpath_parser *)lVar12);
      }
      if (*(char *)((long)&in_RCX[0x41a0]._lexer._cur + 2) == '\0') {
        if (lVar5 == lex_quoted_string) {
          local_48.begin = ((xpath_lexer_string *)unaff_R12)->begin;
          local_48.end = (pxVar14->_lexer)._cur_lexeme_contents.end;
          ppxStack_60 = (xpath_ast_node **)0x11f926;
          xpath_lexer::next((xpath_lexer *)unaff_R14);
          if ((local_50->_lexer)._cur_lexeme == lex_close_brace) {
            ppxStack_60 = (xpath_ast_node **)0x11f93d;
            xpath_lexer::next((xpath_lexer *)unaff_R14);
            cVar15 = '\x06';
            goto LAB_0011f501;
          }
          pcVar16 = "Unmatched brace near processing-instruction()";
          pxVar14 = (xpath_parser *)unaff_R14;
        }
        else {
          pcVar16 = "Only literals are allowed as arguments to processing-instruction()";
          pxVar14 = (xpath_parser *)unaff_R14;
        }
      }
      else {
LAB_0011f98d:
        pcVar16 = "Unmatched brace near node type test";
        pxVar14 = (xpath_parser *)unaff_R14;
      }
    }
  }
LAB_0011f9d0:
  ppxStack_60 = (xpath_ast_node **)
                xpath_ast_node::compare_rel<pugi::impl::(anonymous_namespace)::less>;
  pxVar13 = local_50;
  throw_error(local_50,pcVar16);
  cVar15 = *(char *)((long)&pxVar13->_alloc + 1);
  cVar2 = ((xpath_ast_node *)pcVar16)->_rettype;
  pxStack_88 = pxVar14;
  pxStack_80 = unaff_R12;
  pxStack_78 = unaff_R13;
  pxStack_70 = unaff_R14;
  pxStack_68 = set;
  ppxStack_60 = unaff_RBP;
  if (cVar2 != '\x01' && cVar15 != '\x01') {
    dVar3 = xpath_ast_node::eval_number((xpath_ast_node *)pxVar13,c,(xpath_stack *)in_RCX);
    dVar4 = xpath_ast_node::eval_number((xpath_ast_node *)pcVar16,c,(xpath_stack *)in_RCX);
    unaff_RBP = (xpath_ast_node **)CONCAT71((int7)((ulong)unaff_RBP >> 8),dVar3 < dVar4);
    goto LAB_0011fce1;
  }
  if (cVar2 == '\x01' && cVar15 == '\x01') {
    xStack_110._target = in_RCX->_alloc;
    xStack_110._state._root = (xStack_110._target)->_root;
    xStack_110._state._root_size = (xStack_110._target)->_root_size;
    xpath_ast_node::eval_node_set(&xStack_d8,(xpath_ast_node *)pxVar13,c,(xpath_stack *)in_RCX);
    xpath_ast_node::eval_node_set
              ((xpath_node_set_raw *)&pxStack_f8,(xpath_ast_node *)pcVar16,c,(xpath_stack *)in_RCX);
    if (xStack_d8._begin != xStack_d8._end) {
      pxVar17 = xStack_d8._begin;
      do {
        xStack_b8._target = in_RCX->_alloc;
        xStack_b8._state._root = (xStack_b8._target)->_root;
        xStack_b8._state._root_size = (xStack_b8._target)->_root_size;
        xVar20 = string_value((anon_unknown_0 *)(pxVar17->_node)._root,
                              (xpath_node *)(pxVar17->_attribute)._attr,xStack_b8._target);
        dVar3 = convert_string_to_number(xVar20._buffer);
        for (pxVar19 = pxStack_f0; pxVar19 != pxStack_e8;
            pxVar19 = (xpath_memory_block *)(pxVar19->data + 8)) {
          xStack_a0._target = in_RCX->_alloc;
          xStack_a0._state._root = (xStack_a0._target)->_root;
          xStack_a0._state._root_size = (xStack_a0._target)->_root_size;
          xVar20 = string_value((anon_unknown_0 *)pxVar19->next,*(xpath_node **)pxVar19->data,
                                xStack_a0._target);
          dVar4 = convert_string_to_number(xVar20._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&xStack_a0);
          if (dVar3 < dVar4) {
            xpath_allocator_capture::~xpath_allocator_capture(&xStack_b8);
            unaff_RBP = (xpath_ast_node **)CONCAT71((int7)((ulong)&xStack_a0._state >> 8),1);
            goto LAB_0011fc1f;
          }
        }
        xpath_allocator_capture::~xpath_allocator_capture(&xStack_b8);
        pxVar17 = pxVar17 + 1;
      } while (pxVar17 != xStack_d8._end);
    }
    unaff_RBP = (xpath_ast_node **)0x0;
LAB_0011fc1f:
    this_00 = &xStack_110;
  }
  else {
    if (cVar15 == '\x01' || cVar2 != '\x01') {
      if ((cVar15 != '\x01') || (cVar2 == '\x01')) {
        __assert_fail("!\"Wrong types\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                      ,0x1d8b,
                      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_rel(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::less]"
                     );
      }
      pxStack_f8 = in_RCX->_alloc;
      pxStack_f0 = pxStack_f8->_root;
      pxStack_e8 = (xpath_memory_block *)pxStack_f8->_root_size;
      xpath_ast_node::eval_node_set(&xStack_d8,(xpath_ast_node *)pxVar13,c,(xpath_stack *)in_RCX);
      dVar3 = xpath_ast_node::eval_number((xpath_ast_node *)pcVar16,c,(xpath_stack *)in_RCX);
      if (xStack_d8._begin == xStack_d8._end) goto LAB_0011fcd5;
      pxVar17 = xStack_d8._begin;
      do {
        xStack_110._target = in_RCX->_alloc;
        xStack_110._state._root = (xStack_110._target)->_root;
        xStack_110._state._root_size = (xStack_110._target)->_root_size;
        xVar20 = string_value((anon_unknown_0 *)(pxVar17->_node)._root,
                              (xpath_node *)(pxVar17->_attribute)._attr,xStack_110._target);
        dVar4 = convert_string_to_number(xVar20._buffer);
        xpath_allocator_capture::~xpath_allocator_capture(&xStack_110);
        unaff_RBP = (xpath_ast_node **)CONCAT71((int7)((ulong)unaff_RBP >> 8),dVar4 < dVar3);
        if (dVar4 < dVar3) break;
        pxVar17 = pxVar17 + 1;
      } while (pxVar17 != xStack_d8._end);
    }
    else {
      pxStack_f8 = in_RCX->_alloc;
      pxStack_f0 = pxStack_f8->_root;
      pxStack_e8 = (xpath_memory_block *)pxStack_f8->_root_size;
      dVar3 = xpath_ast_node::eval_number((xpath_ast_node *)pxVar13,c,(xpath_stack *)in_RCX);
      xpath_ast_node::eval_node_set(&xStack_d8,(xpath_ast_node *)pcVar16,c,(xpath_stack *)in_RCX);
      if (xStack_d8._begin == xStack_d8._end) {
LAB_0011fcd5:
        unaff_RBP = (xpath_ast_node **)0x0;
      }
      else {
        pxVar17 = xStack_d8._begin;
        do {
          xStack_110._target = in_RCX->_alloc;
          xStack_110._state._root = (xStack_110._target)->_root;
          xStack_110._state._root_size = (xStack_110._target)->_root_size;
          xVar20 = string_value((anon_unknown_0 *)(pxVar17->_node)._root,
                                (xpath_node *)(pxVar17->_attribute)._attr,xStack_110._target);
          dVar4 = convert_string_to_number(xVar20._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&xStack_110);
          unaff_RBP = (xpath_ast_node **)CONCAT71((int7)((ulong)unaff_RBP >> 8),dVar3 < dVar4);
          if (dVar3 < dVar4) break;
          pxVar17 = pxVar17 + 1;
        } while (pxVar17 != xStack_d8._end);
      }
    }
    this_00 = (xpath_allocator_capture *)&pxStack_f8;
  }
  xpath_allocator_capture::~xpath_allocator_capture(this_00);
LAB_0011fce1:
  return (xpath_ast_node *)((ulong)unaff_RBP & 0xffffffff);
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				throw_error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;
				
				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();
				
				return new (alloc_node()) xpath_ast_node(ast_step, set, axis_self, nodetest_type_node, 0);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();
				
				return new (alloc_node()) xpath_ast_node(ast_step, set, axis_parent, nodetest_type_node, 0);
			}
		
			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;
			
			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified) throw_error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified) throw_error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else throw_error("Unrecognized node test");
				}
				
				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();
						
						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none) throw_error("Unrecognized node type");
							
							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								throw_error("Only literals are allowed as arguments to processing-instruction()");
						
							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();
							
							if (_lexer.current() != lex_close_brace)
								throw_error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
							throw_error("Unmatched brace near node type test");

					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *
							
							nt_type = nodetest_all_in_namespace;
						}
						else nt_type = nodetest_name;
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else throw_error("Unrecognized node test");
			
			xpath_ast_node* n = new (alloc_node()) xpath_ast_node(ast_step, set, axis, nt_type, alloc_string(nt_name));
			
			xpath_ast_node* last = 0;
			
			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();
				
				xpath_ast_node* expr = parse_expression();

				xpath_ast_node* pred = new (alloc_node()) xpath_ast_node(ast_predicate, xpath_type_node_set, expr);
				
				if (_lexer.current() != lex_close_square_brace)
					throw_error("Unmatched square brace");
				_lexer.next();
				
				if (last) last->set_next(pred);
				else n->set_right(pred);
				
				last = pred;
			}
			
			return n;
		}